

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O1

void __thiscall SecureDataManager::~SecureDataManager(SecureDataManager *this)

{
  CryptoFactory *pCVar1;
  MutexFactory *this_00;
  
  this->_vptr_SecureDataManager = (_func_int **)&PTR__SecureDataManager_0019f930;
  pCVar1 = CryptoFactory::i();
  (*pCVar1->_vptr_CryptoFactory[1])(pCVar1,this->aes);
  if (this->mask != (ByteString *)0x0) {
    (*this->mask->_vptr_ByteString[1])();
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->dataMgrMutex);
  (this->magic)._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->magic).byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->maskedKey)._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->maskedKey).byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->soEncryptedKey)._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->soEncryptedKey).byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->userEncryptedKey)._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->userEncryptedKey).byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return;
}

Assistant:

SecureDataManager::~SecureDataManager()
{
	// Recycle the AES instance
	CryptoFactory::i()->recycleSymmetricAlgorithm(aes);

	// Clean up the mask
	delete mask;

	MutexFactory::i()->recycleMutex(dataMgrMutex);
}